

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O3

void __thiscall TPZMHMeshControl::AddBoundaryInterfaceElements(TPZMHMeshControl *this)

{
  int iVar1;
  _Rb_tree_color _Var2;
  long lVar3;
  _Base_ptr p_Var4;
  int iVar5;
  int iVar6;
  TPZCompEl **ppTVar7;
  TPZGeoEl *pTVar8;
  long lVar9;
  TPZInterfaceElement *this_00;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  int64_t iVar13;
  int64_t nelem;
  TPZCompElSide cs;
  TPZGeoElSide gelside;
  set<int,_std::less<int>,_std::allocator<int>_> notincluded;
  TPZGeoElSide gs;
  TPZCompElSide celside;
  TPZStack<TPZCompElSide,_10> celstack;
  TPZCompElSide local_170;
  TPZGeoElSide local_160;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_148;
  TPZGeoElSide local_118;
  TPZCompElSide local_100;
  TPZStack<TPZCompElSide,_10> local_f0;
  
  TPZCompMesh::LoadReferences(((this->fCMesh).fRef)->fPointer);
  iVar1 = ((this->fGMesh).fRef)->fPointer->fDim;
  local_148._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_148._M_impl.super__Rb_tree_header._M_header;
  local_148._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148._M_impl.super__Rb_tree_header._M_header._M_right =
       local_148._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_148,
             &this->fSkeletonMatId);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_148,
             &this->fLagrangeMatIdLeft);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_148,
             &this->fLagrangeMatIdRight);
  lVar3 = (((this->fCMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
          fNElements;
  if (0 < lVar3) {
    nelem = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      if ((((*ppTVar7 != (TPZCompEl *)0x0) &&
           (pTVar8 = TPZCompEl::Reference(*ppTVar7), pTVar8 != (TPZGeoEl *)0x0)) &&
          (iVar5 = (**(code **)(*(long *)pTVar8 + 0x210))(pTVar8), iVar5 != iVar1)) &&
         (iVar5 = (**(code **)(*(long *)pTVar8 + 0x1d0))(pTVar8), iVar5 == 0)) {
        iVar5 = pTVar8->fMatId;
        if (local_148._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var4 = local_148._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var12 = &local_148._M_impl.super__Rb_tree_header._M_header;
          do {
            p_Var11 = p_Var12;
            p_Var10 = p_Var4;
            _Var2 = p_Var10[1]._M_color;
            p_Var12 = p_Var10;
            if ((int)_Var2 < iVar5) {
              p_Var12 = p_Var11;
            }
            p_Var4 = (&p_Var10->_M_left)[(int)_Var2 < iVar5];
          } while ((&p_Var10->_M_left)[(int)_Var2 < iVar5] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var12 != &local_148._M_impl.super__Rb_tree_header) {
            if ((int)_Var2 < iVar5) {
              p_Var10 = p_Var11;
            }
            if ((int)p_Var10[1]._M_color <= iVar5) goto LAB_0139af39;
          }
        }
        iVar6 = (**(code **)(*(long *)pTVar8 + 0x210))(pTVar8);
        if (iVar6 != iVar1 + -1) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                     ,0x403);
        }
        lVar9 = 0x28;
        do {
          *(undefined8 *)
           ((long)local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + lVar9 + -0x28) = 0;
          *(undefined4 *)
           ((long)&(((TPZManVector<TPZCompElSide,_10> *)
                    (local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
                   super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar9) = 0xffffffff;
          lVar9 = lVar9 + 0x10;
        } while (lVar9 != 200);
        local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
             local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
        local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements = 0;
        local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
        local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
             (_func_int **)&PTR__TPZManVector_0181a690;
        local_160.fSide = (**(code **)(*(long *)pTVar8 + 0xf0))(pTVar8);
        local_160.fSide = local_160.fSide + -1;
        local_160.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
        local_160.fGeoEl = pTVar8;
        TPZGeoElSide::Reference(&local_160);
        TPZGeoElSide::EqualorHigherCompElementList2(&local_160,&local_f0,1,0);
        if (0 < local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                fNElements) {
          lVar9 = 8;
          iVar13 = local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                   fNElements;
          do {
            local_170.fEl =
                 *(TPZCompEl **)
                  ((long)local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                         fStore + lVar9 + -8);
            local_170.fSide =
                 *(int *)((long)&(local_f0.super_TPZManVector<TPZCompElSide,_10>.
                                  super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar9);
            TPZCompElSide::Reference(&local_118,&local_170);
            if ((local_118.fGeoEl != local_160.fGeoEl) || (local_118.fSide != local_160.fSide)) {
              pTVar8 = (TPZGeoEl *)
                       (**(code **)(*(long *)local_118.fGeoEl + 0x170))
                                 (local_118.fGeoEl,local_118.fSide,iVar5);
              this_00 = (TPZInterfaceElement *)operator_new(0x80);
              TPZInterfaceElement::TPZInterfaceElement
                        (this_00,((this->fCMesh).fRef)->fPointer,pTVar8,&local_170,&local_100);
            }
            lVar9 = lVar9 + 0x10;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
            local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc) {
          local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
          local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
               (_func_int **)&PTR__TPZVec_018142b0;
          if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
              (TPZCompElSide *)0x0) {
            operator_delete__(local_f0.super_TPZManVector<TPZCompElSide,_10>.
                              super_TPZVec<TPZCompElSide>.fStore);
          }
        }
      }
LAB_0139af39:
      nelem = nelem + 1;
    } while (nelem != lVar3);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_148);
  return;
}

Assistant:

void TPZMHMeshControl::AddBoundaryInterfaceElements()
{
    fCMesh->LoadReferences();
    int dim = fGMesh->Dimension();
    std::set<int> notincluded;
    notincluded.insert(fSkeletonMatId);
    notincluded.insert(fLagrangeMatIdLeft);
    notincluded.insert(fLagrangeMatIdRight);
    int64_t nel = fCMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fCMesh->ElementVec()[el];
        if (!cel) {
            continue;
        }
        TPZGeoEl *gel = cel->Reference();
        if (!gel || gel->Dimension() == dim || gel->HasSubElement()) {
            continue;
        }
        int matid = gel->MaterialId();
        if (notincluded.find(matid) != notincluded.end()) {
            continue;
        }
        if (gel->Dimension() != dim-1) {
            DebugStop();
        }
        TPZStack<TPZCompElSide> celstack;
        TPZGeoElSide gelside(gel,gel->NSides()-1);
        TPZCompElSide celside = gelside.Reference();
        gelside.EqualorHigherCompElementList2(celstack, 1, 0);
        int64_t nst = celstack.size();
        for (int64_t i=0; i<nst; i++) {
            TPZCompElSide cs = celstack[i];
            TPZGeoElSide gs = cs.Reference();
            if (gs == gelside) {
                continue;
            }
            TPZGeoEl *gelnew = gs.Element()->CreateBCGeoEl(gs.Side(), matid);
            new TPZInterfaceElement(fCMesh, gelnew, cs, celside);

        }
    }
}